

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O2

void __thiscall Image_Wrap2D_Test::TestBody(Image_Wrap2D_Test *this)

{
  char *pcVar1;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  polymorphic_allocator<float> local_1f0;
  AssertHelper local_1e8;
  AssertionResult gtest_ar;
  WrapMode2D local_1c0;
  WrapMode2D local_1b8;
  WrapMode2D local_1b0;
  WrapMode2D local_1a8;
  WrapMode2D local_1a0;
  WrapMode2D local_198;
  WrapMode2D local_190;
  WrapMode2D local_188;
  WrapMode2D local_180;
  WrapMode2D local_178;
  WrapMode2D local_170;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_168;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> texels;
  Image zeroOne;
  
  zeroOne.channelNames.field_2._0_4_ = 0;
  zeroOne.format = U256;
  zeroOne.resolution.super_Tuple2<pbrt::Point2,_int>.x = 0x3f800000;
  zeroOne.resolution.super_Tuple2<pbrt::Point2,_int>.y = 0;
  zeroOne._12_4_ = 0;
  zeroOne.channelNames.alloc.memoryResource = (memory_resource *)0x0;
  zeroOne.channelNames.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  gtest_ar._0_8_ = pstd::pmr::new_delete_resource();
  pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>::vector<float_const*>
            ((vector<float,pstd::pmr::polymorphic_allocator<float>> *)&texels,(float *)&zeroOne,
             (float *)((long)&zeroOne.channelNames.field_2 + 4),
             (polymorphic_allocator<float> *)&gtest_ar);
  local_1f0.memoryResource = pstd::pmr::new_delete_resource();
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (&local_168,&texels,&local_1f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"Y",(allocator<char> *)&local_1e8);
  channels.n = 1;
  channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar;
  pbrt::Image::Image(&zeroOne,&local_168,(Point2i)0x300000003,channels);
  std::__cxx11::string::~string((string *)&gtest_ar);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_168);
  local_1f0.memoryResource._0_4_ = 1;
  pbrt::WrapMode2D::WrapMode2D(&local_170,Clamp,Clamp);
  local_1e8.data_._0_4_ = pbrt::Image::GetChannel(&zeroOne,(Point2i)0xffffffff00000001,0,local_170);
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&gtest_ar,"1",
             "zeroOne.GetChannel({1, -1}, 0, {WrapMode::Clamp, WrapMode::Clamp})",(int *)&local_1f0,
             (float *)&local_1e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1f0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x23b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_1f0.memoryResource._0_4_ = 1;
  pbrt::WrapMode2D::WrapMode2D(&local_178,Black,Clamp);
  local_1e8.data_._0_4_ = pbrt::Image::GetChannel(&zeroOne,(Point2i)0xffffffff00000001,0,local_178);
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&gtest_ar,"1",
             "zeroOne.GetChannel({1, -1}, 0, {WrapMode::Black, WrapMode::Clamp})",(int *)&local_1f0,
             (float *)&local_1e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1f0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x23c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_1f0.memoryResource =
       (memory_resource *)((ulong)local_1f0.memoryResource & 0xffffffff00000000);
  pbrt::WrapMode2D::WrapMode2D(&local_180,Black,Repeat);
  local_1e8.data_._0_4_ = pbrt::Image::GetChannel(&zeroOne,(Point2i)0xffffffff00000001,0,local_180);
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&gtest_ar,"0",
             "zeroOne.GetChannel({1, -1}, 0, {WrapMode::Black, WrapMode::Repeat})",(int *)&local_1f0
             ,(float *)&local_1e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1f0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x23d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_1f0.memoryResource =
       (memory_resource *)((ulong)local_1f0.memoryResource & 0xffffffff00000000);
  pbrt::WrapMode2D::WrapMode2D(&local_188,Clamp,Black);
  local_1e8.data_._0_4_ = pbrt::Image::GetChannel(&zeroOne,(Point2i)0xffffffff00000001,0,local_188);
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&gtest_ar,"0",
             "zeroOne.GetChannel({1, -1}, 0, {WrapMode::Clamp, WrapMode::Black})",(int *)&local_1f0,
             (float *)&local_1e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1f0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x23e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_1f0.memoryResource =
       (memory_resource *)((ulong)local_1f0.memoryResource & 0xffffffff00000000);
  pbrt::WrapMode2D::WrapMode2D(&local_190,Clamp,Clamp);
  local_1e8.data_._0_4_ = pbrt::Image::GetChannel(&zeroOne,(Point2i)0x300000001,0,local_190);
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&gtest_ar,"0",
             "zeroOne.GetChannel({1, 3}, 0, {WrapMode::Clamp, WrapMode::Clamp})",(int *)&local_1f0,
             (float *)&local_1e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1f0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x240,pcVar1);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_1f0.memoryResource =
       (memory_resource *)((ulong)local_1f0.memoryResource & 0xffffffff00000000);
  pbrt::WrapMode2D::WrapMode2D(&local_198,Repeat,Clamp);
  local_1e8.data_._0_4_ = pbrt::Image::GetChannel(&zeroOne,(Point2i)0x300000001,0,local_198);
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&gtest_ar,"0",
             "zeroOne.GetChannel({1, 3}, 0, {WrapMode::Repeat, WrapMode::Clamp})",(int *)&local_1f0,
             (float *)&local_1e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1f0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x241,pcVar1);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_1f0.memoryResource._0_4_ = 1;
  pbrt::WrapMode2D::WrapMode2D(&local_1a0,Black,Repeat);
  local_1e8.data_._0_4_ = pbrt::Image::GetChannel(&zeroOne,(Point2i)0x300000001,0,local_1a0);
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&gtest_ar,"1",
             "zeroOne.GetChannel({1, 3}, 0, {WrapMode::Black, WrapMode::Repeat})",(int *)&local_1f0,
             (float *)&local_1e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1f0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x242,pcVar1);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_1f0.memoryResource =
       (memory_resource *)((ulong)local_1f0.memoryResource & 0xffffffff00000000);
  pbrt::WrapMode2D::WrapMode2D(&local_1a8,Clamp,Black);
  local_1e8.data_._0_4_ = pbrt::Image::GetChannel(&zeroOne,(Point2i)0x300000001,0,local_1a8);
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&gtest_ar,"0",
             "zeroOne.GetChannel({1, 3}, 0, {WrapMode::Clamp, WrapMode::Black})",(int *)&local_1f0,
             (float *)&local_1e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1f0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x243,pcVar1);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_1f0.memoryResource = (memory_resource *)0x3fe0000000000000;
  pbrt::WrapMode2D::WrapMode2D(&local_1b0,Repeat);
  local_1e8.data_._0_4_ =
       pbrt::Image::BilerpChannel(&zeroOne,(Point2f)SUB648(ZEXT464(0x3f000000),0),0,local_1b0);
  testing::internal::CmpHelperEQ<double,float>
            ((internal *)&gtest_ar,"0.5",
             "zeroOne.BilerpChannel(Point2f(0.5, 0.), 0, WrapMode::Repeat)",(double *)&local_1f0,
             (float *)&local_1e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1f0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x245,pcVar1);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_1f0.memoryResource = (memory_resource *)0x3fe0000000000000;
  pbrt::WrapMode2D::WrapMode2D(&local_1b8,Black);
  local_1e8.data_._0_4_ =
       pbrt::Image::BilerpChannel(&zeroOne,(Point2f)SUB648(ZEXT464(0x3f000000),0),0,local_1b8);
  testing::internal::CmpHelperEQ<double,float>
            ((internal *)&gtest_ar,"0.5",
             "zeroOne.BilerpChannel(Point2f(0.5, 0.), 0, WrapMode::Black)",(double *)&local_1f0,
             (float *)&local_1e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1f0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x246,pcVar1);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_1f0.memoryResource._0_4_ = 1;
  pbrt::WrapMode2D::WrapMode2D(&local_1c0,Clamp);
  local_1e8.data_._0_4_ =
       pbrt::Image::BilerpChannel(&zeroOne,(Point2f)SUB648(ZEXT464(0x3f000000),0),0,local_1c0);
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&gtest_ar,"1","zeroOne.BilerpChannel(Point2f(0.5, 0.), 0, WrapMode::Clamp)"
             ,(int *)&local_1f0,(float *)&local_1e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1f0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x247,pcVar1);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  pbrt::Image::~Image(&zeroOne);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&texels);
  return;
}

Assistant:

TEST(Image, Wrap2D) {
    pstd::vector<float> texels = {Float(0), Float(1), Float(0), Float(0), Float(0),
                                  Float(0), Float(0), Float(0), Float(0)};
    Image zeroOne(texels, {3, 3}, {"Y"});

    EXPECT_EQ(1, zeroOne.GetChannel({1, -1}, 0, {WrapMode::Clamp, WrapMode::Clamp}));
    EXPECT_EQ(1, zeroOne.GetChannel({1, -1}, 0, {WrapMode::Black, WrapMode::Clamp}));
    EXPECT_EQ(0, zeroOne.GetChannel({1, -1}, 0, {WrapMode::Black, WrapMode::Repeat}));
    EXPECT_EQ(0, zeroOne.GetChannel({1, -1}, 0, {WrapMode::Clamp, WrapMode::Black}));

    EXPECT_EQ(0, zeroOne.GetChannel({1, 3}, 0, {WrapMode::Clamp, WrapMode::Clamp}));
    EXPECT_EQ(0, zeroOne.GetChannel({1, 3}, 0, {WrapMode::Repeat, WrapMode::Clamp}));
    EXPECT_EQ(1, zeroOne.GetChannel({1, 3}, 0, {WrapMode::Black, WrapMode::Repeat}));
    EXPECT_EQ(0, zeroOne.GetChannel({1, 3}, 0, {WrapMode::Clamp, WrapMode::Black}));

    EXPECT_EQ(0.5, zeroOne.BilerpChannel(Point2f(0.5, 0.), 0, WrapMode::Repeat));
    EXPECT_EQ(0.5, zeroOne.BilerpChannel(Point2f(0.5, 0.), 0, WrapMode::Black));
    EXPECT_EQ(1, zeroOne.BilerpChannel(Point2f(0.5, 0.), 0, WrapMode::Clamp));
}